

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::JobManager::CollectJobsValue(Value *__return_storage_ptr__,JobManager *this)

{
  value_t vVar1;
  pointer ppJVar2;
  json_value jVar3;
  Value *pVVar4;
  bool bVar5;
  uint64_t uVar6;
  reference this_00;
  _Alloc_hider _Var7;
  pointer ppJVar8;
  json json;
  string valueStr;
  undefined1 local_160 [8];
  json_value local_158;
  Value *local_150;
  JobManager *local_148;
  undefined1 local_140 [8];
  json_value local_138;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  undefined1 local_120 [8];
  char local_118 [16];
  _Alloc_hider local_108;
  char local_f8 [16];
  string local_e8;
  _Any_data local_c8;
  code *local_b8;
  undefined8 uStack_b0;
  string local_a0 [2];
  input_adapter local_60;
  string_t local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_140[0] = null;
  local_138.object = (object_t *)0x0;
  local_150 = __return_storage_ptr__;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_140);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_140);
  ppJVar8 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppJVar2 = (this->mJobPool).
            super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_148 = this;
  if (ppJVar8 != ppJVar2) {
    do {
      bVar5 = Job::IsStopped(*ppJVar8);
      if (!bVar5) {
        __assert_fail("condition",
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                      ,0x2a8,"Interpreter::Value ot::commissioner::JobManager::CollectJobsValue()");
      }
      Job::GetValue((Value *)local_130,*ppJVar8);
      bVar5 = Interpreter::Value::HasNoError((Value *)local_130);
      if (local_108._M_p != local_f8) {
        operator_delete(local_108._M_p);
      }
      if (local_128._M_p != local_118) {
        operator_delete(local_128._M_p);
      }
      if (bVar5) {
        uVar6 = Job::GetXpanId(*ppJVar8);
        Job::GetValue((Value *)local_130,*ppJVar8);
        Interpreter::Value::ToString_abi_cxx11_(&local_e8,(Value *)local_130);
        if (local_108._M_p != local_f8) {
          operator_delete(local_108._M_p);
        }
        if (local_128._M_p != local_118) {
          operator_delete(local_128._M_p);
        }
        if (local_e8._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)0x0,0x2dc959);
        }
        nlohmann::detail::input_adapter::
        input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
                  (&local_60,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_e8._M_dataplus._M_p,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(local_e8._M_dataplus._M_p + local_e8._M_string_length));
        local_b8 = (code *)0x0;
        uStack_b0 = 0;
        local_c8._M_unused._M_object = (void *)0x0;
        local_c8._8_8_ = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_160,&local_60,(parser_callback_t *)&local_c8,true);
        utils::Hex<unsigned_long>((string *)local_130,uVar6);
        this_00 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_140,(key_type *)local_130);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_160);
        vVar1 = this_00->m_type;
        this_00->m_type = local_160[0];
        jVar3 = this_00->m_value;
        this_00->m_value = local_158;
        local_160[0] = vVar1;
        local_158 = jVar3;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(this_00);
        if ((undefined1 *)CONCAT44(local_130._4_4_,local_130._0_4_) != local_120) {
          operator_delete((undefined1 *)CONCAT44(local_130._4_4_,local_130._0_4_));
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_160);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_160 + 8),local_160[0]);
        if (local_b8 != (code *)0x0) {
          (*local_b8)(&local_c8,&local_c8,__destroy_functor);
        }
        if (local_60.ia.
            super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.ia.
                     super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        _Var7._M_p = local_e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_00285667:
          operator_delete(_Var7._M_p);
        }
      }
      else {
        uVar6 = Job::GetXpanId(*ppJVar8);
        Job::GetValue((Value *)local_130,*ppJVar8);
        Interpreter::Value::ToString_abi_cxx11_(local_a0,(Value *)local_130);
        ErrorMsg(local_148,uVar6,local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0[0]._M_dataplus._M_p != &local_a0[0].field_2) {
          operator_delete(local_a0[0]._M_dataplus._M_p);
        }
        if (local_108._M_p != local_f8) {
          operator_delete(local_108._M_p);
        }
        _Var7._M_p = local_128._M_p;
        if (local_128._M_p != local_118) goto LAB_00285667;
      }
      ppJVar8 = ppJVar8 + 1;
    } while (ppJVar8 != ppJVar2);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(&local_50,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_140,4,' ',false,strict);
  pVVar4 = local_150;
  Interpreter::Value::Value((Value *)local_130,&local_50);
  (pVVar4->mError).mCode = local_130._0_4_;
  std::__cxx11::string::operator=((string *)&(pVVar4->mError).mMessage,(string *)&local_128);
  std::__cxx11::string::operator=((string *)&pVVar4->mData,(string *)&local_108);
  if (local_108._M_p != local_f8) {
    operator_delete(local_108._M_p);
  }
  if (local_128._M_p != local_118) {
    operator_delete(local_128._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_140);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_140 + 8),local_140[0]);
  return pVVar4;
}

Assistant:

Interpreter::Value JobManager::CollectJobsValue()
{
    Interpreter::Value value;
    nlohmann::json     json;
    uint64_t           xpan;

    for (const auto &job : mJobPool)
    {
        ASSERT(job->IsStopped());
        if (job->GetValue().HasNoError())
        {
            xpan = job->GetXpanId();
            try
            {
                std::string valueStr = job->GetValue().ToString();
                if (valueStr.empty())
                {
                    // this may occur with non-dataset commands
                    // like 'start', 'stop', etc.
                    valueStr = "true";
                    // please note, this is where job-based execution
                    // is different from single command run when
                    // nothing but [done] is printed; we need to see a
                    // distinguished result per network
                }
                json[utils::Hex(xpan)] = nlohmann::json::parse(valueStr);
            } catch (std::exception &e)
            {
                ErrorMsg(xpan, e.what());
            }
        }
        else // produce error messages immediately before printing value
        {
            ErrorMsg(job->GetXpanId(), job->GetValue().ToString());
        }
    }
    value = json.dump(JSON_INDENT_DEFAULT);
    return value;
}